

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element_const&>
          (QPodArrayOps<QtCbor::Element> *this,qsizetype i,Element *args)

{
  Element **ppEVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  anon_union_8_2_4ee71171_for_Element_0 aVar4;
  Type TVar5;
  ValueFlags VVar6;
  Element *pEVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QtCbor::Element>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_002e8af2:
    aVar4 = args->field_0;
    TVar5 = args->type;
    VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QtCbor::Element>).size != 0);
    QArrayDataPointer<QtCbor::Element>::detachAndGrow
              (&this->super_QArrayDataPointer<QtCbor::Element>,where,1,(Element **)0x0,
               (QArrayDataPointer<QtCbor::Element> *)0x0);
    pEVar7 = createHole(this,where,i,1);
    pEVar7->field_0 = aVar4;
    pEVar7->type = TVar5;
    pEVar7->flags =
         (ValueFlags)
         VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  }
  else {
    if (((this->super_QArrayDataPointer<QtCbor::Element>).size == i) &&
       (pEVar7 = (this->super_QArrayDataPointer<QtCbor::Element>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pEVar7 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      TVar5 = args->type;
      VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
      pEVar7 = pEVar7 + i;
      pEVar7->field_0 = args->field_0;
      pEVar7->type = TVar5;
      pEVar7->flags =
           (ValueFlags)
           VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    }
    else {
      if ((i != 0) ||
         (pEVar7 = (this->super_QArrayDataPointer<QtCbor::Element>).ptr,
         (Element *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pEVar7)) goto LAB_002e8af2;
      TVar5 = args->type;
      VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
      pEVar7[-1].field_0 = args->field_0;
      pEVar7[-1].type = TVar5;
      pEVar7[-1].flags =
           (ValueFlags)
           VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      ppEVar1 = &(this->super_QArrayDataPointer<QtCbor::Element>).ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QtCbor::Element>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }